

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void common_timeout_callback(int fd,short what,void *arg)

{
  event_base *base;
  event *ev;
  long lVar1;
  event *extraout_RDX;
  event *head;
  event *extraout_RDX_00;
  timeval now;
  
  base = *(event_base **)((long)arg + 0xa0);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  gettime(base,&now);
  head = extraout_RDX;
  do {
    ev = *arg;
    if (ev == (event *)0x0) {
LAB_00264322:
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      return;
    }
    lVar1 = (ev->ev_timeout).tv_sec;
    if ((now.tv_sec < lVar1) ||
       ((lVar1 == now.tv_sec &&
        (now.tv_usec < (long)(ulong)((uint)(ev->ev_timeout).tv_usec & 0xfffff))))) {
      common_timeout_schedule((common_timeout_list *)arg,(timeval *)ev,head);
      goto LAB_00264322;
    }
    event_del_nolock_(ev,0);
    event_active_nolock_(ev,1,1);
    head = extraout_RDX_00;
  } while( true );
}

Assistant:

static void
common_timeout_callback(evutil_socket_t fd, short what, void *arg)
{
	struct timeval now;
	struct common_timeout_list *ctl = arg;
	struct event_base *base = ctl->base;
	struct event *ev = NULL;
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	gettime(base, &now);
	while (1) {
		ev = TAILQ_FIRST(&ctl->events);
		if (!ev || ev->ev_timeout.tv_sec > now.tv_sec ||
		    (ev->ev_timeout.tv_sec == now.tv_sec &&
			(ev->ev_timeout.tv_usec&MICROSECONDS_MASK) > now.tv_usec))
			break;
		event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
		event_active_nolock_(ev, EV_TIMEOUT, 1);
	}
	if (ev)
		common_timeout_schedule(ctl, &now, ev);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}